

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O0

void * evthread_posix_lock_alloc(uint locktype)

{
  int iVar1;
  pthread_mutex_t *lock;
  pthread_mutexattr_t *attr;
  pthread_mutex_t *ppStack_10;
  uint locktype_local;
  
  lock = (pthread_mutex_t *)0x0;
  ppStack_10 = (pthread_mutex_t *)event_mm_malloc_(0x28);
  if (ppStack_10 == (pthread_mutex_t *)0x0) {
    ppStack_10 = (pthread_mutex_t *)0x0;
  }
  else {
    if ((locktype & 1) != 0) {
      lock = (pthread_mutex_t *)&attr_recursive;
    }
    iVar1 = pthread_mutex_init(ppStack_10,(pthread_mutexattr_t *)lock);
    if (iVar1 != 0) {
      event_mm_free_(ppStack_10);
      ppStack_10 = (pthread_mutex_t *)0x0;
    }
  }
  return ppStack_10;
}

Assistant:

static void *
evthread_posix_lock_alloc(unsigned locktype)
{
	pthread_mutexattr_t *attr = NULL;
	pthread_mutex_t *lock = mm_malloc(sizeof(pthread_mutex_t));
	if (!lock)
		return NULL;
	if (locktype & EVTHREAD_LOCKTYPE_RECURSIVE)
		attr = &attr_recursive;
	if (pthread_mutex_init(lock, attr)) {
		mm_free(lock);
		return NULL;
	}
	return lock;
}